

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>
::int_writer<int,fmt::v5::basic_format_specs<char>>::bin_writer<1>::operator()
          (bin_writer<1> *this,
          back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> *it)

{
  int iVar1;
  bool bVar2;
  back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> bVar3;
  byte *pbVar4;
  uint uVar5;
  char buffer [34];
  undefined8 uStack_40;
  char acStack_38 [48];
  
  bVar3 = (back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>)it->container;
  iVar1 = *(int *)(this + 4);
  pbVar4 = (byte *)(acStack_38 + (long)iVar1 + -1);
  uVar5 = *(uint *)this;
  do {
    *pbVar4 = (byte)uVar5 & 1 | 0x30;
    pbVar4 = pbVar4 + -1;
    bVar2 = 1 < uVar5;
    uVar5 = uVar5 >> 1;
  } while (bVar2);
  uStack_40 = 0x1d4773;
  bVar3 = std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<char*,std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>>
                    (acStack_38,acStack_38 + iVar1,bVar3);
  it->container = (list<char,_std::allocator<char>_> *)bVar3;
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_uint<BITS, char_type>(it, abs_value, num_digits);
      }